

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_vm.hpp
# Opt level: O2

void __thiscall squall::VM::~VM(VM *this)

{
  sq_setforeignptr((this->imp_).vm_,(SQUserPointer)0x0);
  std::unique_ptr<squall::TableBase,_std::default_delete<squall::TableBase>_>::~unique_ptr
            (&this->root_table_);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->klass_table_);
  detail::VMImp::~VMImp(&this->imp_);
  return;
}

Assistant:

~VM() { sq_setforeignptr(handle(), 0); }